

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::RGBIlluminantSpectrum,pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>>::
vector<pbrt::RGBIlluminantSpectrum_const*>
          (vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
           *this,RGBIlluminantSpectrum *first,RGBIlluminantSpectrum *last,
          polymorphic_allocator<pbrt::RGBIlluminantSpectrum> *alloc)

{
  undefined8 *in_RCX;
  vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
  *in_RDX;
  vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
  *in_RSI;
  polymorphic_allocator<pbrt::RGBIlluminantSpectrum> *in_RDI;
  RGBIlluminantSpectrum *iter;
  size_t i;
  vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
  *local_30;
  long local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  local_30 = in_RSI;
  vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
  ::reserve(in_RSI,(size_t)in_RDX);
  local_28 = 0;
  for (; local_30 != in_RDX;
      local_30 = (vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
                  *)&local_30->nStored) {
    pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>::
    construct<pbrt::RGBIlluminantSpectrum,pbrt::RGBIlluminantSpectrum_const&>
              (in_RDI,(RGBIlluminantSpectrum *)(in_RDI[1].memoryResource + local_28 * 3),
               (RGBIlluminantSpectrum *)local_30);
    local_28 = local_28 + 1;
  }
  in_RDI[3].memoryResource = in_RDI[2].memoryResource;
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }